

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O0

bool tinyusdz::orthonormalize_basis(double3 *tx,double3 *ty,double3 *tz,bool normalize,double eps)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double3 local_438;
  double3 local_420;
  double3 local_408;
  double local_3f0;
  double error;
  double3 zDiff;
  double3 yDiff;
  double3 xDiff;
  double local_398;
  double local_390;
  double3 local_388;
  double3 local_370;
  double3 local_358;
  double3 local_340;
  double3 local_328;
  double3 local_310;
  double3 local_2f8;
  double3 local_2e0;
  double3 local_2c8;
  double3 local_2b0;
  double3 local_298;
  double3 local_280;
  double3 local_268;
  double3 local_250;
  double3 local_238;
  double3 local_220;
  double3 local_208;
  double3 local_1f0;
  double3 local_1d8;
  double3 local_1c0;
  int local_1a8;
  undefined4 local_1a4;
  int iter;
  int kMAX_ITERS;
  double local_198;
  double local_190;
  double3 local_188;
  double3 local_170;
  double3 local_158;
  double3 local_140;
  double3 local_128;
  undefined1 local_110 [8];
  double3 cz;
  double3 bz;
  double3 az;
  double3 cy;
  double3 by;
  double3 ay;
  double3 cx;
  double3 bx;
  double3 ax;
  double eps_local;
  bool normalize_local;
  double3 *tz_local;
  double3 *ty_local;
  double3 *tx_local;
  
  if (normalize) {
    vnormalize(&local_128,tx,2.220446049250313e-16);
    tx->_M_elems[0] = local_128._M_elems[0];
    tx->_M_elems[1] = local_128._M_elems[1];
    tx->_M_elems[2] = local_128._M_elems[2];
    vnormalize(&local_140,ty,2.220446049250313e-16);
    ty->_M_elems[0] = local_140._M_elems[0];
    ty->_M_elems[1] = local_140._M_elems[1];
    ty->_M_elems[2] = local_140._M_elems[2];
    vnormalize(&local_158,tz,2.220446049250313e-16);
    tz->_M_elems[0] = local_158._M_elems[0];
    tz->_M_elems[1] = local_158._M_elems[1];
    tz->_M_elems[2] = local_158._M_elems[2];
    bx._M_elems[2] = tx->_M_elems[0];
    by._M_elems[2] = ty->_M_elems[0];
    ay._M_elems[0] = ty->_M_elems[1];
    ay._M_elems[1] = ty->_M_elems[2];
    bz._M_elems[2] = tz->_M_elems[0];
    az._M_elems[0] = tz->_M_elems[1];
    az._M_elems[1] = tz->_M_elems[2];
  }
  else {
    vnormalize(&local_170,tx,2.220446049250313e-16);
    bx._M_elems[2] = local_170._M_elems[0];
    vnormalize(&local_188,ty,2.220446049250313e-16);
    by._M_elems[2] = local_188._M_elems[0];
    ay._M_elems[0] = local_188._M_elems[1];
    ay._M_elems[1] = local_188._M_elems[2];
    vnormalize((double3 *)&iter,tz,2.220446049250313e-16);
    bz._M_elems[2] = _iter;
    az._M_elems[0] = local_198;
    az._M_elems[1] = local_190;
  }
  bVar1 = math::is_close((double3 *)(bx._M_elems + 2),(double3 *)(by._M_elems + 2),eps);
  if (((bVar1) ||
      (bVar1 = math::is_close((double3 *)(bx._M_elems + 2),(double3 *)(bz._M_elems + 2),eps), bVar1)
      ) || (bVar1 = math::is_close((double3 *)(by._M_elems + 2),(double3 *)(bz._M_elems + 2),eps),
           bVar1)) {
    tx_local._7_1_ = false;
  }
  else {
    local_1a4 = 0x14;
    for (local_1a8 = 0; local_1a8 < 0x14; local_1a8 = local_1a8 + 1) {
      cx._M_elems[2] = tx->_M_elems[0];
      bx._M_elems[0] = tx->_M_elems[1];
      bx._M_elems[1] = tx->_M_elems[2];
      cy._M_elems[2] = ty->_M_elems[0];
      by._M_elems[0] = ty->_M_elems[1];
      by._M_elems[1] = ty->_M_elems[2];
      cz._M_elems[2] = tz->_M_elems[0];
      bz._M_elems[0] = tz->_M_elems[1];
      bz._M_elems[1] = tz->_M_elems[2];
      dVar2 = vdot((double3 *)(by._M_elems + 2),(double3 *)(cx._M_elems + 2));
      operator*(&local_1d8,dVar2,(double3 *)(by._M_elems + 2));
      operator-(&local_1c0,(double3 *)(cx._M_elems + 2),&local_1d8);
      cx._M_elems[2] = local_1c0._M_elems[0];
      bx._M_elems[0] = local_1c0._M_elems[1];
      bx._M_elems[1] = local_1c0._M_elems[2];
      dVar2 = vdot((double3 *)(bz._M_elems + 2),(double3 *)(cx._M_elems + 2));
      operator*(&local_208,dVar2,(double3 *)(bz._M_elems + 2));
      operator-(&local_1f0,(double3 *)(cx._M_elems + 2),&local_208);
      cx._M_elems[2] = local_1f0._M_elems[0];
      bx._M_elems[0] = local_1f0._M_elems[1];
      bx._M_elems[1] = local_1f0._M_elems[2];
      dVar2 = vdot((double3 *)(bx._M_elems + 2),(double3 *)(cy._M_elems + 2));
      operator*(&local_238,dVar2,(double3 *)(bx._M_elems + 2));
      operator-(&local_220,(double3 *)(cy._M_elems + 2),&local_238);
      cy._M_elems[2] = local_220._M_elems[0];
      by._M_elems[0] = local_220._M_elems[1];
      by._M_elems[1] = local_220._M_elems[2];
      dVar2 = vdot((double3 *)(bz._M_elems + 2),(double3 *)(cy._M_elems + 2));
      operator*(&local_268,dVar2,(double3 *)(bz._M_elems + 2));
      operator-(&local_250,(double3 *)(cy._M_elems + 2),&local_268);
      cy._M_elems[2] = local_250._M_elems[0];
      by._M_elems[0] = local_250._M_elems[1];
      by._M_elems[1] = local_250._M_elems[2];
      dVar2 = vdot((double3 *)(bx._M_elems + 2),(double3 *)(cz._M_elems + 2));
      operator*(&local_298,dVar2,(double3 *)(bx._M_elems + 2));
      operator-(&local_280,(double3 *)(cz._M_elems + 2),&local_298);
      cz._M_elems[2] = local_280._M_elems[0];
      bz._M_elems[0] = local_280._M_elems[1];
      bz._M_elems[1] = local_280._M_elems[2];
      dVar2 = vdot((double3 *)(by._M_elems + 2),(double3 *)(cz._M_elems + 2));
      operator*(&local_2c8,dVar2,(double3 *)(by._M_elems + 2));
      operator-(&local_2b0,(double3 *)(cz._M_elems + 2),&local_2c8);
      cz._M_elems[2] = local_2b0._M_elems[0];
      bz._M_elems[0] = local_2b0._M_elems[1];
      bz._M_elems[1] = local_2b0._M_elems[2];
      operator+(&local_2f8,tx,(double3 *)(cx._M_elems + 2));
      operator*(&local_2e0,0.5,&local_2f8);
      ay._M_elems[2] = local_2e0._M_elems[0];
      cx._M_elems[0] = local_2e0._M_elems[1];
      cx._M_elems[1] = local_2e0._M_elems[2];
      operator+(&local_328,ty,(double3 *)(cy._M_elems + 2));
      operator*(&local_310,0.5,&local_328);
      az._M_elems[2] = local_310._M_elems[0];
      cy._M_elems[0] = local_310._M_elems[1];
      cy._M_elems[1] = local_310._M_elems[2];
      operator+(&local_358,tz,(double3 *)(cz._M_elems + 2));
      operator*(&local_340,0.5,&local_358);
      local_110 = (undefined1  [8])local_340._M_elems[0];
      cz._M_elems[0] = local_340._M_elems[1];
      cz._M_elems[1] = local_340._M_elems[2];
      if (normalize) {
        vnormalize(&local_370,(double3 *)(ay._M_elems + 2),2.220446049250313e-16);
        ay._M_elems[2] = local_370._M_elems[0];
        cx._M_elems[0] = local_370._M_elems[1];
        cx._M_elems[1] = local_370._M_elems[2];
        vnormalize(&local_388,(double3 *)(az._M_elems + 2),2.220446049250313e-16);
        az._M_elems[2] = local_388._M_elems[0];
        cy._M_elems[0] = local_388._M_elems[1];
        cy._M_elems[1] = local_388._M_elems[2];
        vnormalize((double3 *)(xDiff._M_elems + 2),(double3 *)local_110,2.220446049250313e-16);
        local_110 = (undefined1  [8])xDiff._M_elems[2];
        cz._M_elems[0] = local_398;
        cz._M_elems[1] = local_390;
      }
      operator-((double3 *)(yDiff._M_elems + 2),tx,(double3 *)(ay._M_elems + 2));
      operator-((double3 *)(zDiff._M_elems + 2),ty,(double3 *)(az._M_elems + 2));
      operator-((double3 *)&error,tz,(double3 *)local_110);
      dVar2 = vdot((double3 *)(yDiff._M_elems + 2),(double3 *)(yDiff._M_elems + 2));
      dVar3 = vdot((double3 *)(zDiff._M_elems + 2),(double3 *)(zDiff._M_elems + 2));
      local_3f0 = vdot((double3 *)&error,(double3 *)&error);
      local_3f0 = dVar2 + dVar3 + local_3f0;
      if (local_3f0 < eps * eps) break;
      tx->_M_elems[0] = ay._M_elems[2];
      tx->_M_elems[1] = cx._M_elems[0];
      tx->_M_elems[2] = cx._M_elems[1];
      ty->_M_elems[0] = az._M_elems[2];
      ty->_M_elems[1] = cy._M_elems[0];
      ty->_M_elems[2] = cy._M_elems[1];
      tz->_M_elems[0] = (double)local_110;
      tz->_M_elems[1] = cz._M_elems[0];
      tz->_M_elems[2] = cz._M_elems[1];
      bx._M_elems[2] = tx->_M_elems[0];
      by._M_elems[2] = ty->_M_elems[0];
      ay._M_elems[0] = ty->_M_elems[1];
      ay._M_elems[1] = ty->_M_elems[2];
      bz._M_elems[2] = tz->_M_elems[0];
      az._M_elems[0] = tz->_M_elems[1];
      az._M_elems[1] = tz->_M_elems[2];
      if (!normalize) {
        vnormalize(&local_408,(double3 *)(bx._M_elems + 2),2.220446049250313e-16);
        bx._M_elems[2] = local_408._M_elems[0];
        vnormalize(&local_420,(double3 *)(by._M_elems + 2),2.220446049250313e-16);
        bx._M_elems[2] = local_420._M_elems[0];
        vnormalize(&local_438,(double3 *)(bz._M_elems + 2),2.220446049250313e-16);
        bx._M_elems[2] = local_438._M_elems[0];
      }
    }
    tx_local._7_1_ = local_1a8 < 0x14;
  }
  return tx_local._7_1_;
}

Assistant:

bool orthonormalize_basis(value::double3 &tx, value::double3 &ty,
                          value::double3 &tz, const bool normalize,
                          const double eps) {
  value::double3 ax, bx, cx, ay, by, cy, az, bz, cz;

  if (normalize) {
    tx = vnormalize(tx);
    ty = vnormalize(ty);
    tz = vnormalize(tz);
    ax = tx;
    ay = ty;
    az = tz;
  } else {
    ax = vnormalize(tx);
    ay = vnormalize(ty);
    az = vnormalize(tz);
  }

  /* Check for colinear vectors. This is not only a quick-out: the
   * error computation below will evaluate to zero if there's no change
   * after an iteration, which can happen either because we have a good
   * solution or because the vectors are colinear.   So we have to check
   * the colinear case beforehand, or we'll get fooled in the error
   * computation.
   */
  if (math::is_close(ax, ay, eps) || math::is_close(ax, az, eps) ||
      math::is_close(ay, az, eps)) {
    return false;
  }

  constexpr int kMAX_ITERS = 20;
  int iter;
  for (iter = 0; iter < kMAX_ITERS; ++iter) {
    bx = tx;
    by = ty;
    bz = tz;

    bx = bx - vdot(ay, bx) * ay;
    bx = bx - vdot(az, bx) * az;

    by = by - vdot(ax, by) * ax;
    by = by - vdot(az, by) * az;

    bz = bz - vdot(ax, bz) * ax;
    bz = bz - vdot(ay, bz) * ay;

    cx = 0.5 * (tx + bx);
    cy = 0.5 * (ty + by);
    cz = 0.5 * (tz + bz);

    if (normalize) {
      cx = vnormalize(cx);
      cy = vnormalize(cy);
      cz = vnormalize(cz);
    }

    value::double3 xDiff = tx - cx;
    value::double3 yDiff = ty - cy;
    value::double3 zDiff = tz - cz;

    double error = vdot(xDiff, xDiff) + vdot(yDiff, yDiff) + vdot(zDiff, zDiff);

    // error is squared, so compare to squared tolerance
    if (error < (eps * eps)) {
      break;
    }

    tx = cx;
    ty = cy;
    tz = cz;

    ax = tx;
    ay = ty;
    az = tz;

    if (!normalize) {
      ax = vnormalize(ax);
      ax = vnormalize(ay);
      ax = vnormalize(az);
    }
  }

  return iter < kMAX_ITERS;
}